

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

int nsc_regen(lws_cache_nscookiejar_t *cache,char *wc_delete,void *pay,size_t pay_size)

{
  int fd_00;
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  size_t sVar4;
  int local_e0;
  int ret;
  int fd;
  char filepath [128];
  nsc_regen_ctx ctx;
  size_t pay_size_local;
  void *pay_local;
  char *wc_delete_local;
  lws_cache_nscookiejar_t *cache_local;
  
  local_e0 = 1;
  fd_00 = nsc_backing_open_lock(cache,0,"nsc_regen");
  if (fd_00 < 0) {
    return 1;
  }
  lws_snprintf((char *)&ret,0x80,"%s.tmp",(cache->cache).info.u);
  unlink((char *)&ret);
  iVar1 = open((char *)&ret,0x41,0x180);
  if (-1 < iVar1) {
    sVar3 = write(iVar1,"# Netscape HTTP Cookie File\n",0x1c);
    if (((sVar3 == 0x1c) &&
        ((pay == (void *)0x0 || (sVar4 = write(iVar1,pay,pay_size & 0xffffffff), sVar4 == pay_size))
        )) && ((pay == (void *)0x0 || (sVar3 = write(iVar1,"\n",1), sVar3 == 1)))) {
      (cache->cache).current_footprint = 0;
      filepath._120_8_ = wc_delete;
      lws_now_usecs();
      cache->earliest_expiry = 0;
      iVar2 = nscookiejar_iterate(cache,fd_00,nsc_regen_cb,filepath + 0x78);
      if (iVar2 == 0) {
        close(iVar1);
        iVar1 = unlink((char *)(cache->cache).info.u);
        if (iVar1 == -1) {
          _lws_log(8,"%s: unlink %s failed\n","nsc_regen",(cache->cache).info.u);
        }
        iVar1 = rename((char *)&ret,(char *)(cache->cache).info.u);
        if (iVar1 == -1) {
          _lws_log(8,"%s: rename %s failed\n","nsc_regen",(cache->cache).info.u);
        }
        if (cache->earliest_expiry != 0) {
          lws_cache_schedule(&cache->cache,expiry_cb,cache->earliest_expiry);
        }
        local_e0 = 0;
        goto LAB_0012571b;
      }
    }
    if (-1 < iVar1) {
      close(iVar1);
    }
  }
LAB_0012571b:
  unlink((char *)&ret);
  nsc_backing_close_unlock(cache,fd_00);
  return local_e0;
}

Assistant:

static int
nsc_regen(lws_cache_nscookiejar_t *cache, const char *wc_delete,
	  const void *pay, size_t pay_size)
{
	struct nsc_regen_ctx ctx;
	char filepath[128];
	int fd, ret = 1;

	fd = nsc_backing_open_lock(cache, LWS_O_RDONLY, __func__);
	if (fd < 0)
		return 1;

	lws_snprintf(filepath, sizeof(filepath), "%s.tmp",
			cache->cache.info.u.nscookiejar.filepath);
	unlink(filepath);

	if (lws_fi(&cache->cache.info.cx->fic, "cache_regen_temp_open"))
		goto bail;

	ctx.fdt = open(filepath, LWS_O_CREAT | LWS_O_WRONLY, 0600);
	if (ctx.fdt < 0)
		goto bail;

	/* magic header */

	if (lws_fi(&cache->cache.info.cx->fic, "cache_regen_temp_write") ||
	/* other consumers insist to see this at start of cookie jar */
	    write(ctx.fdt, "# Netscape HTTP Cookie File\n", 28) != 28)
		goto bail1;

	/* if we are adding something, put it first */

	if (pay &&
	    write(ctx.fdt, pay, /*msvc*/(unsigned int)pay_size) !=
						    (ssize_t)pay_size)
		goto bail1;
	if (pay && write(ctx.fdt, "\n", 1u) != (ssize_t)1)
		goto bail1;

	cache->cache.current_footprint = 0;

	ctx.wildcard_key_delete = wc_delete;
	ctx.add_data = pay;
	ctx.add_size = pay_size;
	ctx.curr = lws_now_usecs();
	ctx.drop = 0;

	cache->earliest_expiry = 0;

	if (lws_fi(&cache->cache.info.cx->fic, "cache_regen_iter_fail") ||
	    nscookiejar_iterate(cache, fd, nsc_regen_cb, &ctx))
		goto bail1;

	close(ctx.fdt);
	ctx.fdt = -1;

	if (unlink(cache->cache.info.u.nscookiejar.filepath) == -1)
		lwsl_info("%s: unlink %s failed\n", __func__,
			  cache->cache.info.u.nscookiejar.filepath);
	if (rename(filepath, cache->cache.info.u.nscookiejar.filepath) == -1)
		lwsl_info("%s: rename %s failed\n", __func__,
			  cache->cache.info.u.nscookiejar.filepath);

	if (cache->earliest_expiry)
		lws_cache_schedule(&cache->cache, expiry_cb,
				   cache->earliest_expiry);

	ret = 0;
	goto bail;

bail1:
	if (ctx.fdt >= 0)
		close(ctx.fdt);
bail:
	unlink(filepath);

	nsc_backing_close_unlock(cache, fd);

	return ret;
}